

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_gather_sampler_cube_array_shadow(NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  NotSupportedError *this;
  char *__s;
  DataType pDataType;
  undefined8 in_R9;
  DataType in_stack_fffffffffffffd68;
  bool local_1c2;
  bool local_1c1;
  string local_1c0;
  undefined1 local_1a0 [8];
  string shaderSource_3;
  undefined1 local_160 [8];
  string shaderSource_2;
  undefined1 local_120 [8];
  string shaderSource_1;
  undefined1 local_e0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  int shaderNdx;
  byte local_4d;
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar4 = ::deGetFalse();
    local_3a = 0;
    local_4d = 0;
    local_1c1 = false;
    if (dVar4 == 0) {
      pRVar5 = NegativeTestContext::getRenderContext(local_10);
      local_14.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
      local_18 = (deUint32)glu::ApiType::es(3,2);
      bVar3 = glu::contextSupports(local_14,(ApiType)local_18);
      pNVar2 = local_10;
      local_1c2 = true;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_3a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"GL_EXT_texture_cube_map_array",&local_39);
        local_4d = 1;
        local_1c2 = NegativeTestContext::isExtensionSupported(pNVar2,&local_38);
      }
      local_1c1 = local_1c2;
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator(&local_39);
    }
    if (((local_1c1 ^ 0xffU) & 1) != 0) break;
    dVar4 = ::deGetFalse();
    pNVar2 = local_10;
    if (dVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaderNdx,"textureGrad - samplerCubeArrayShadow",&local_71);
      NegativeTestContext::beginSection(pNVar2,(string *)&shaderNdx);
      std::__cxx11::string::~string((string *)&shaderNdx);
      std::allocator<char>::~allocator(&local_71);
      for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
        bVar3 = NegativeTestContext::isShaderSupported
                          (local_10,*(ShaderType *)
                                     ((anonymous_namespace)::s_shaders + (long)local_78 * 4));
        pNVar2 = local_10;
        pDataType = (DataType)in_R9;
        if (bVar3) {
          __s = glu::getShaderTypeName
                          (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,__s,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_98,"Verify shader: ",&local_b8);
          NegativeTestContext::beginSection(pNVar2,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                    ((string *)local_e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x33,
                     TYPE_FLOAT,pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e0);
          (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                    ((string *)local_120,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x33,
                     TYPE_FLOAT,TYPE_FLOAT,in_stack_fffffffffffffd68);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_120);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_120);
          (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                    ((string *)local_160,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x33,
                     TYPE_FLOAT_VEC4,TYPE_INT,in_stack_fffffffffffffd68);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_160);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_160);
          in_R9 = 1;
          (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                    ((string *)local_1a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x2c,
                     TYPE_FLOAT_VEC4,TYPE_FLOAT,in_stack_fffffffffffffd68);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string((string *)&local_1c0,(string *)local_1a0);
          verifyShader(pNVar2,SVar1,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)local_1a0);
          NegativeTestContext::endSection(local_10);
        }
      }
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,
             "Test requires extension GL_EXT_texture_cube_map_array or context version 3.2 or higher."
             ,
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_texture_cube_map_array\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
             ,0xdb8);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void texture_gather_sampler_cube_array_shadow (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(
		NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_texture_cube_map_array"),
		"Test requires extension GL_EXT_texture_cube_map_array or context version 3.2 or higher.");

	ctx.beginSection("textureGrad - samplerCubeArrayShadow");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC4, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}